

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_tests.cpp
# Opt level: O1

void skiwi::format_test_6(void)

{
  format_options ops;
  string res;
  long *local_498 [2];
  long local_488 [2];
  format_options local_474 [4];
  undefined4 local_470;
  long *local_468 [2];
  long local_458 [2];
  long *local_448;
  long local_440;
  long local_438 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  long *local_408 [2];
  long local_3f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  long *local_3c8 [2];
  long local_3b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  long *local_388 [2];
  long local_378 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  long *local_348 [2];
  long local_338 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  long *local_308 [2];
  long local_2f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  long *local_2c8 [2];
  long local_2b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  long *local_288 [2];
  long local_278 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  long *local_248 [2];
  long local_238 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  long *local_208 [2];
  long local_1f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  long *local_188 [2];
  long local_178 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  long *local_148 [2];
  long local_138 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  long *local_108 [2];
  long local_f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  long *local_c8 [2];
  long local_b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  long *local_88 [2];
  long local_78 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48 [2];
  long local_38 [2];
  
  skiwi::format_options::format_options(local_474);
  local_470 = 10;
  local_468[0] = local_458;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_468,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))","");
  skiwi::format((string *)local_48,(format_options *)local_468);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_448,(EVP_PKEY_CTX *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,
             "\n(define append\n  (lambda (l m)\n          (if (null? l)\n              m\n              (cons\n                (car l)\n                (append\n                  (cdr l) m)))))\n"
             ,"");
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_68,(EVP_PKEY_CTX *)local_248);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_448,local_440 + (long)local_448);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_68,&local_268,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0x92,"void skiwi::format_test_6()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  local_470 = 0x14;
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_498,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))","");
  skiwi::format((string *)local_88,(format_options *)local_498);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_468,(EVP_PKEY_CTX *)local_88);
  std::__cxx11::string::operator=((string *)&local_448,(string *)local_468);
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,
             "\n(define append (lambda\n                 (l m)\n                 (if (null? l)\n                     m\n                     (cons\n                       (car l)\n                       (append\n                         (cdr l) m)))))\n"
             ,"");
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_a8,(EVP_PKEY_CTX *)local_288);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a8,local_448,local_440 + (long)local_448);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_a8,&local_2a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0x9f,"void skiwi::format_test_6()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  local_470 = 0x1e;
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_498,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))","");
  skiwi::format((string *)local_c8,(format_options *)local_498);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_468,(EVP_PKEY_CTX *)local_c8);
  std::__cxx11::string::operator=((string *)&local_448,(string *)local_468);
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c8,
             "\n(define append (lambda (l m)\n                       (if (null? l)\n                           m (cons\n                               (car l)\n                               (append\n                                 (cdr l) m)))))\n"
             ,"");
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_e8,(EVP_PKEY_CTX *)local_2c8);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e8,local_448,local_440 + (long)local_448);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_e8,&local_2e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xaa,"void skiwi::format_test_6()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_2c8[0] != local_2b8) {
    operator_delete(local_2c8[0],local_2b8[0] + 1);
  }
  local_470 = 0x28;
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_498,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))","");
  skiwi::format((string *)local_108,(format_options *)local_498);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_468,(EVP_PKEY_CTX *)local_108);
  std::__cxx11::string::operator=((string *)&local_448,(string *)local_468);
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0],local_f8[0] + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,
             "\n(define append (lambda (l m)\n                       (if (null? l) m (cons\n                                         (car l)\n                                         (append\n                                           (cdr l) m)))))\n"
             ,"");
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_128,(EVP_PKEY_CTX *)local_308);
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_328,local_448,local_440 + (long)local_448);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_128,&local_328,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xb4,"void skiwi::format_test_6()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_308[0] != local_2f8) {
    operator_delete(local_308[0],local_2f8[0] + 1);
  }
  local_470 = 0x32;
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_498,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))","");
  skiwi::format((string *)local_148,(format_options *)local_498);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_468,(EVP_PKEY_CTX *)local_148);
  std::__cxx11::string::operator=((string *)&local_448,(string *)local_468);
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,
             "\n(define append (lambda (l m)\n                       (if (null? l) m (cons (car l)\n                                             (append\n                                               (cdr l) m)))))\n"
             ,"");
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_168,(EVP_PKEY_CTX *)local_348);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,local_448,local_440 + (long)local_448);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_168,&local_368,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xbd,"void skiwi::format_test_6()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if (local_348[0] != local_338) {
    operator_delete(local_348[0],local_338[0] + 1);
  }
  local_470 = 0x3c;
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_498,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))","");
  skiwi::format((string *)local_188,(format_options *)local_498);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_468,(EVP_PKEY_CTX *)local_188);
  std::__cxx11::string::operator=((string *)&local_448,(string *)local_468);
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0],local_178[0] + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_388,
             "\n(define append (lambda (l m) (if (null? l) m (cons (car l)\n                                                   (append (cdr l)\n                                                           m)))))\n"
             ,"");
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_1a8,(EVP_PKEY_CTX *)local_388);
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a8,local_448,local_440 + (long)local_448);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_1a8,&local_3a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xc5,"void skiwi::format_test_6()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if (local_388[0] != local_378) {
    operator_delete(local_388[0],local_378[0] + 1);
  }
  local_470 = 0x46;
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_498,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))","");
  skiwi::format((string *)local_1c8,(format_options *)local_498);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_468,(EVP_PKEY_CTX *)local_1c8);
  std::__cxx11::string::operator=((string *)&local_448,(string *)local_468);
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c8,
             "\n(define append (lambda (l m) (if (null? l) m (cons (car l) (append (cdr l)\n                                                                   m)))))\n"
             ,"");
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_1e8,(EVP_PKEY_CTX *)local_3c8);
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e8,local_448,local_440 + (long)local_448);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_1e8,&local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xcc,"void skiwi::format_test_6()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_3c8[0] != local_3b8) {
    operator_delete(local_3c8[0],local_3b8[0] + 1);
  }
  local_470 = 0x50;
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_498,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))","");
  skiwi::format((string *)local_208,(format_options *)local_498);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_468,(EVP_PKEY_CTX *)local_208);
  std::__cxx11::string::operator=((string *)&local_448,(string *)local_468);
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_408,
             "\n(define append (lambda (l m) (if (null? l) m (cons (car l) (append (cdr l) m)))))\n"
             ,"");
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_228,(EVP_PKEY_CTX *)local_408);
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_428,local_448,local_440 + (long)local_448);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_228,&local_428,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xd2,"void skiwi::format_test_6()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (local_408[0] != local_3f8) {
    operator_delete(local_408[0],local_3f8[0] + 1);
  }
  if (local_448 != local_438) {
    operator_delete(local_448,local_438[0] + 1);
  }
  return;
}

Assistant:

void format_test_6()
  {
  format_options ops;
  ops.max_width = 10;
  auto res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append
  (lambda (l m)
          (if (null? l)
              m
              (cons
                (car l)
                (append
                  (cdr l) m)))))
)"), res);

  ops.max_width = 20;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda
                 (l m)
                 (if (null? l)
                     m
                     (cons
                       (car l)
                       (append
                         (cdr l) m)))))
)"), res);

  ops.max_width = 30;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m)
                       (if (null? l)
                           m (cons
                               (car l)
                               (append
                                 (cdr l) m)))))
)"), res);

  ops.max_width = 40;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m)
                       (if (null? l) m (cons
                                         (car l)
                                         (append
                                           (cdr l) m)))))
)"), res);

  ops.max_width = 50;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m)
                       (if (null? l) m (cons (car l)
                                             (append
                                               (cdr l) m)))))
)"), res);

  ops.max_width = 60;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m) (if (null? l) m (cons (car l)
                                                   (append (cdr l)
                                                           m)))))
)"), res);

  ops.max_width = 70;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m) (if (null? l) m (cons (car l) (append (cdr l)
                                                                   m)))))
)"), res);

  ops.max_width = 80;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m) (if (null? l) m (cons (car l) (append (cdr l) m)))))
)"), res);
  }